

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int jitopt_level(jit_State *J,char *str)

{
  uint local_24;
  uint32_t flags;
  char *str_local;
  jit_State *J_local;
  
  if (((*str < '0') || ('9' < *str)) || (str[1] != '\0')) {
    J_local._4_4_ = 0;
  }
  else {
    if (*str == '0') {
      local_24 = 0;
    }
    else if (*str == '1') {
      local_24 = 0x70000;
    }
    else if (*str == '2') {
      local_24 = 0x670000;
    }
    else {
      local_24 = 0x3ff0000;
    }
    J->flags = J->flags & 0xf000ffff | local_24;
    J_local._4_4_ = 1;
  }
  return J_local._4_4_;
}

Assistant:

static int jitopt_level(jit_State *J, const char *str)
{
  if (str[0] >= '0' && str[0] <= '9' && str[1] == '\0') {
    uint32_t flags;
    if (str[0] == '0') flags = JIT_F_OPT_0;
    else if (str[0] == '1') flags = JIT_F_OPT_1;
    else if (str[0] == '2') flags = JIT_F_OPT_2;
    else flags = JIT_F_OPT_3;
    J->flags = (J->flags & ~JIT_F_OPT_MASK) | flags;
    return 1;  /* Ok. */
  }
  return 0;  /* No match. */
}